

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

XML_Parser
coda_XML_ExternalEntityParserCreate(XML_Parser oldParser,XML_Char *context,XML_Char *encodingName)

{
  HASH_TABLE *table;
  HASH_TABLE *table_00;
  STRING_POOL *newPool;
  XML_Bool XVar1;
  XML_Bool XVar2;
  XML_ParamEntityParsing XVar3;
  DTD *oldTable;
  ELEMENT_TYPE *pEVar4;
  XML_Parser pXVar5;
  XML_Parser pXVar6;
  unsigned_long uVar7;
  HASH_TABLE *pHVar8;
  KEY pXVar9;
  uint uVar10;
  XML_Bool XVar11;
  int iVar12;
  XML_Parser parser;
  XML_Char *pXVar13;
  NAMED *pNVar14;
  NAMED *pNVar15;
  PREFIX *pPVar16;
  KEY pXVar17;
  NAMED *pNVar18;
  code *pcVar19;
  DTD *pDVar20;
  NAMED **ppNVar21;
  XML_Parser pXVar22;
  long lVar23;
  long lVar24;
  NAMED **ppNVar25;
  XML_Char tmp [2];
  NAMED **local_118;
  NAMED **local_110;
  XML_Char local_ea [2];
  HASH_TABLE *local_e8;
  XML_EndElementHandler p_Stack_e0;
  XML_Char *local_d0;
  XML_EntityDeclHandler local_c8;
  XML_XmlDeclHandler p_Stack_c0;
  XML_ElementDeclHandler local_b8;
  XML_AttlistDeclHandler p_Stack_b0;
  XML_SkippedEntityHandler local_a8;
  XML_UnknownEncodingHandler p_Stack_a0;
  XML_NotStandaloneHandler local_98;
  XML_ExternalEntityRefHandler p_Stack_90;
  XML_StartNamespaceDeclHandler local_88;
  XML_EndNamespaceDeclHandler p_Stack_80;
  XML_UnparsedEntityDeclHandler local_78;
  XML_NotationDeclHandler p_Stack_70;
  XML_EndCdataSectionHandler local_68;
  XML_DefaultHandler p_Stack_60;
  XML_CommentHandler local_58;
  XML_StartCdataSectionHandler p_Stack_50;
  XML_CharacterDataHandler local_48;
  XML_ProcessingInstructionHandler p_Stack_40;
  
  if (oldParser == (XML_Parser)0x0) {
    return (XML_Parser)0x0;
  }
  oldTable = oldParser->m_dtd;
  local_e8 = (HASH_TABLE *)oldParser->m_startElementHandler;
  p_Stack_e0 = oldParser->m_endElementHandler;
  local_48 = oldParser->m_characterDataHandler;
  p_Stack_40 = oldParser->m_processingInstructionHandler;
  local_58 = oldParser->m_commentHandler;
  p_Stack_50 = oldParser->m_startCdataSectionHandler;
  local_68 = oldParser->m_endCdataSectionHandler;
  p_Stack_60 = oldParser->m_defaultHandler;
  local_78 = oldParser->m_unparsedEntityDeclHandler;
  p_Stack_70 = oldParser->m_notationDeclHandler;
  local_88 = oldParser->m_startNamespaceDeclHandler;
  p_Stack_80 = oldParser->m_endNamespaceDeclHandler;
  local_98 = oldParser->m_notStandaloneHandler;
  p_Stack_90 = oldParser->m_externalEntityRefHandler;
  local_a8 = oldParser->m_skippedEntityHandler;
  p_Stack_a0 = oldParser->m_unknownEncodingHandler;
  local_b8 = oldParser->m_elementDeclHandler;
  p_Stack_b0 = oldParser->m_attlistDeclHandler;
  local_c8 = oldParser->m_entityDeclHandler;
  p_Stack_c0 = oldParser->m_xmlDeclHandler;
  pEVar4 = oldParser->m_declElementType;
  pXVar22 = (XML_Parser)oldParser->m_userData;
  pXVar5 = (XML_Parser)oldParser->m_handlerArg;
  XVar11 = oldParser->m_defaultExpandInternalEntities;
  pXVar6 = oldParser->m_externalEntityRefHandlerArg;
  XVar3 = oldParser->m_paramEntityParsing;
  iVar12 = (oldParser->m_prologState).inEntityValue;
  XVar1 = oldParser->m_ns_triplets;
  uVar7 = oldParser->m_hash_secret_salt;
  XVar2 = oldParser->m_reparseDeferralEnabled;
  pDVar20 = (DTD *)0x0;
  if (context == (XML_Char *)0x0) {
    pDVar20 = oldTable;
  }
  if (oldParser->m_ns == '\0') {
    pXVar13 = (XML_Char *)0x0;
  }
  else {
    local_ea[0] = oldParser->m_namespaceSeparator;
    pXVar13 = local_ea;
    local_ea[1] = 0;
  }
  local_d0 = context;
  parser = parserCreate(encodingName,&oldParser->m_mem,pXVar13,pDVar20);
  if (parser == (XML_Parser)0x0) {
    return (XML_Parser)0x0;
  }
  parser->m_startElementHandler = (XML_StartElementHandler)local_e8;
  parser->m_endElementHandler = p_Stack_e0;
  parser->m_characterDataHandler = local_48;
  parser->m_processingInstructionHandler = p_Stack_40;
  parser->m_commentHandler = local_58;
  parser->m_startCdataSectionHandler = p_Stack_50;
  parser->m_endCdataSectionHandler = local_68;
  parser->m_defaultHandler = p_Stack_60;
  parser->m_unparsedEntityDeclHandler = local_78;
  parser->m_notationDeclHandler = p_Stack_70;
  parser->m_startNamespaceDeclHandler = local_88;
  parser->m_endNamespaceDeclHandler = p_Stack_80;
  parser->m_notStandaloneHandler = local_98;
  parser->m_externalEntityRefHandler = p_Stack_90;
  parser->m_skippedEntityHandler = local_a8;
  parser->m_unknownEncodingHandler = p_Stack_a0;
  parser->m_elementDeclHandler = local_b8;
  parser->m_attlistDeclHandler = p_Stack_b0;
  parser->m_entityDeclHandler = local_c8;
  parser->m_xmlDeclHandler = p_Stack_c0;
  parser->m_declElementType = pEVar4;
  parser->m_userData = pXVar22;
  if (pXVar22 != pXVar5) {
    pXVar22 = parser;
  }
  parser->m_handlerArg = pXVar22;
  if (pXVar6 != oldParser) {
    parser->m_externalEntityRefHandlerArg = pXVar6;
  }
  parser->m_defaultExpandInternalEntities = XVar11;
  parser->m_ns_triplets = XVar1;
  parser->m_hash_secret_salt = uVar7;
  parser->m_reparseDeferralEnabled = XVar2;
  parser->m_parentParser = oldParser;
  parser->m_paramEntityParsing = XVar3;
  (parser->m_prologState).inEntityValue = iVar12;
  if (local_d0 == (XML_Char *)0x0) {
    parser->m_isParamEntity = '\x01';
    coda_XmlPrologStateInitExternalEntity(&parser->m_prologState);
    pcVar19 = externalParEntInitProcessor;
LAB_00169cc1:
    parser->m_processor = pcVar19;
    return parser;
  }
  pDVar20 = parser->m_dtd;
  ppNVar21 = (oldTable->prefixes).v;
  if (ppNVar21 == (NAMED **)0x0) {
    ppNVar25 = (NAMED **)0x0;
  }
  else {
    ppNVar25 = ppNVar21 + (oldTable->prefixes).size;
  }
  newPool = &pDVar20->pool;
  table = &pDVar20->prefixes;
  do {
    if (ppNVar21 == ppNVar25) {
      ppNVar21 = (oldTable->attributeIds).v;
      if (ppNVar21 == (NAMED **)0x0) {
        local_118 = (NAMED **)0x0;
      }
      else {
        local_118 = ppNVar21 + (oldTable->attributeIds).size;
      }
      table_00 = &pDVar20->attributeIds;
      local_e8 = (HASH_TABLE *)&oldTable->defaultPrefix;
      goto LAB_00169d8b;
    }
    pNVar14 = *ppNVar21;
    ppNVar21 = ppNVar21 + 1;
  } while ((pNVar14 == (NAMED *)0x0) ||
          ((pXVar13 = poolCopyString(newPool,pNVar14->name), pXVar13 != (XML_Char *)0x0 &&
           (pNVar14 = lookup(oldParser,table,pXVar13,0x10), pNVar14 != (NAMED *)0x0))));
  goto LAB_00169d23;
LAB_00169d8b:
  if (ppNVar21 != local_118) {
    pNVar14 = *ppNVar21;
    ppNVar21 = ppNVar21 + 1;
    if (pNVar14 != (NAMED *)0x0) {
      pXVar13 = (pDVar20->pool).ptr;
      if (pXVar13 == (pDVar20->pool).end) {
        XVar11 = poolGrow(newPool);
        if (XVar11 == '\0') goto LAB_00169d23;
        pXVar13 = (pDVar20->pool).ptr;
      }
      (pDVar20->pool).ptr = pXVar13 + 1;
      *pXVar13 = '\0';
      pXVar13 = poolCopyString(newPool,pNVar14->name);
      if ((pXVar13 == (XML_Char *)0x0) ||
         (pNVar15 = lookup(oldParser,table_00,pXVar13 + 1,0x18), pNVar15 == (NAMED *)0x0))
      goto LAB_00169d23;
      *(undefined1 *)&pNVar15[2].name = *(undefined1 *)&pNVar14[2].name;
      pHVar8 = (HASH_TABLE *)pNVar14[1].name;
      if (pHVar8 != (HASH_TABLE *)0x0) {
        *(undefined1 *)((long)&pNVar15[2].name + 1) = *(undefined1 *)((long)&pNVar14[2].name + 1);
        pPVar16 = &pDVar20->defaultPrefix;
        if (pHVar8 != local_e8) {
          pPVar16 = (PREFIX *)lookup(oldParser,table,(KEY)pHVar8->v,0);
        }
        pNVar15[1].name = (KEY)pPVar16;
      }
    }
    goto LAB_00169d8b;
  }
  ppNVar21 = (oldTable->elementTypes).v;
  if (ppNVar21 == (NAMED **)0x0) {
    local_110 = (NAMED **)0x0;
  }
  else {
    local_110 = ppNVar21 + (oldTable->elementTypes).size;
  }
  local_e8 = &pDVar20->elementTypes;
  while (ppNVar21 != local_110) {
    pNVar14 = *ppNVar21;
    ppNVar21 = ppNVar21 + 1;
    if (pNVar14 != (NAMED *)0x0) {
      pXVar13 = poolCopyString(newPool,pNVar14->name);
      if ((pXVar13 == (XML_Char *)0x0) ||
         (pNVar15 = lookup(oldParser,local_e8,pXVar13,0x28), pNVar15 == (NAMED *)0x0))
      goto LAB_00169d23;
      if ((long)*(int *)&pNVar14[3].name != 0) {
        pXVar17 = (KEY)(*(parser->m_mem).malloc_fcn)((long)*(int *)&pNVar14[3].name * 0x18);
        pNVar15[4].name = pXVar17;
        if (pXVar17 == (KEY)0x0) goto LAB_00169d23;
      }
      if (pNVar14[2].name != (KEY)0x0) {
        pNVar18 = lookup(oldParser,table_00,*(KEY *)pNVar14[2].name,0);
        pNVar15[2].name = (KEY)pNVar18;
      }
      iVar12 = *(int *)&pNVar14[3].name;
      *(int *)&pNVar15[3].name = iVar12;
      *(int *)((long)&pNVar15[3].name + 4) = iVar12;
      if (pNVar14[1].name != (KEY)0x0) {
        pNVar18 = lookup(oldParser,table,*(KEY *)pNVar14[1].name,0);
        pNVar15[1].name = (KEY)pNVar18;
        iVar12 = *(int *)&pNVar15[3].name;
      }
      if (0 < iVar12) {
        lVar24 = 0;
        lVar23 = 0;
        do {
          pNVar18 = lookup(oldParser,table_00,(KEY)**(undefined8 **)(pNVar14[4].name + lVar24),0);
          pXVar17 = pNVar15[4].name;
          *(NAMED **)(pXVar17 + lVar24) = pNVar18;
          pXVar9 = pNVar14[4].name;
          pXVar17[lVar24 + 8] = pXVar9[lVar24 + 8];
          pXVar13 = *(XML_Char **)(pXVar9 + lVar24 + 0x10);
          if (pXVar13 == (XML_Char *)0x0) {
            pXVar17 = pXVar17 + lVar24 + 0x10;
            pXVar17[0] = '\0';
            pXVar17[1] = '\0';
            pXVar17[2] = '\0';
            pXVar17[3] = '\0';
            pXVar17[4] = '\0';
            pXVar17[5] = '\0';
            pXVar17[6] = '\0';
            pXVar17[7] = '\0';
          }
          else {
            pXVar13 = poolCopyString(newPool,pXVar13);
            *(XML_Char **)(pNVar15[4].name + lVar24 + 0x10) = pXVar13;
            if (pXVar13 == (XML_Char *)0x0) goto LAB_00169d23;
          }
          lVar23 = lVar23 + 1;
          lVar24 = lVar24 + 0x18;
        } while (lVar23 < *(int *)&pNVar15[3].name);
      }
    }
  }
  iVar12 = copyEntityTable(oldParser,&pDVar20->generalEntities,newPool,&oldTable->generalEntities);
  if ((iVar12 != 0) &&
     (iVar12 = copyEntityTable(oldParser,&pDVar20->paramEntities,newPool,&oldTable->paramEntities),
     iVar12 != 0)) {
    XVar11 = oldTable->hasParamEntityRefs;
    XVar1 = oldTable->standalone;
    XVar2 = oldTable->paramEntityRead;
    pDVar20->keepProcessing = oldTable->keepProcessing;
    pDVar20->hasParamEntityRefs = XVar11;
    pDVar20->standalone = XVar1;
    pDVar20->paramEntityRead = XVar2;
    pDVar20->in_eldecl = oldTable->in_eldecl;
    pDVar20->scaffold = oldTable->scaffold;
    uVar10 = oldTable->scaffSize;
    pDVar20->contentStringLen = oldTable->contentStringLen;
    pDVar20->scaffSize = uVar10;
    pDVar20->scaffLevel = oldTable->scaffLevel;
    pDVar20->scaffIndex = oldTable->scaffIndex;
    XVar11 = setContext(parser,local_d0);
    if (XVar11 != '\0') {
      pcVar19 = externalEntityInitProcessor;
      goto LAB_00169cc1;
    }
  }
LAB_00169d23:
  coda_XML_ParserFree(parser);
  return (XML_Parser)0x0;
}

Assistant:

XML_Parser XMLCALL
XML_ExternalEntityParserCreate(XML_Parser oldParser, const XML_Char *context,
                               const XML_Char *encodingName) {
  XML_Parser parser = oldParser;
  DTD *newDtd = NULL;
  DTD *oldDtd;
  XML_StartElementHandler oldStartElementHandler;
  XML_EndElementHandler oldEndElementHandler;
  XML_CharacterDataHandler oldCharacterDataHandler;
  XML_ProcessingInstructionHandler oldProcessingInstructionHandler;
  XML_CommentHandler oldCommentHandler;
  XML_StartCdataSectionHandler oldStartCdataSectionHandler;
  XML_EndCdataSectionHandler oldEndCdataSectionHandler;
  XML_DefaultHandler oldDefaultHandler;
  XML_UnparsedEntityDeclHandler oldUnparsedEntityDeclHandler;
  XML_NotationDeclHandler oldNotationDeclHandler;
  XML_StartNamespaceDeclHandler oldStartNamespaceDeclHandler;
  XML_EndNamespaceDeclHandler oldEndNamespaceDeclHandler;
  XML_NotStandaloneHandler oldNotStandaloneHandler;
  XML_ExternalEntityRefHandler oldExternalEntityRefHandler;
  XML_SkippedEntityHandler oldSkippedEntityHandler;
  XML_UnknownEncodingHandler oldUnknownEncodingHandler;
  XML_ElementDeclHandler oldElementDeclHandler;
  XML_AttlistDeclHandler oldAttlistDeclHandler;
  XML_EntityDeclHandler oldEntityDeclHandler;
  XML_XmlDeclHandler oldXmlDeclHandler;
  ELEMENT_TYPE *oldDeclElementType;

  void *oldUserData;
  void *oldHandlerArg;
  XML_Bool oldDefaultExpandInternalEntities;
  XML_Parser oldExternalEntityRefHandlerArg;
#ifdef XML_DTD
  enum XML_ParamEntityParsing oldParamEntityParsing;
  int oldInEntityValue;
#endif
  XML_Bool oldns_triplets;
  /* Note that the new parser shares the same hash secret as the old
     parser, so that dtdCopy and copyEntityTable can lookup values
     from hash tables associated with either parser without us having
     to worry which hash secrets each table has.
  */
  unsigned long oldhash_secret_salt;
  XML_Bool oldReparseDeferralEnabled;

  /* Validate the oldParser parameter before we pull everything out of it */
  if (oldParser == NULL)
    return NULL;

  /* Stash the original parser contents on the stack */
  oldDtd = parser->m_dtd;
  oldStartElementHandler = parser->m_startElementHandler;
  oldEndElementHandler = parser->m_endElementHandler;
  oldCharacterDataHandler = parser->m_characterDataHandler;
  oldProcessingInstructionHandler = parser->m_processingInstructionHandler;
  oldCommentHandler = parser->m_commentHandler;
  oldStartCdataSectionHandler = parser->m_startCdataSectionHandler;
  oldEndCdataSectionHandler = parser->m_endCdataSectionHandler;
  oldDefaultHandler = parser->m_defaultHandler;
  oldUnparsedEntityDeclHandler = parser->m_unparsedEntityDeclHandler;
  oldNotationDeclHandler = parser->m_notationDeclHandler;
  oldStartNamespaceDeclHandler = parser->m_startNamespaceDeclHandler;
  oldEndNamespaceDeclHandler = parser->m_endNamespaceDeclHandler;
  oldNotStandaloneHandler = parser->m_notStandaloneHandler;
  oldExternalEntityRefHandler = parser->m_externalEntityRefHandler;
  oldSkippedEntityHandler = parser->m_skippedEntityHandler;
  oldUnknownEncodingHandler = parser->m_unknownEncodingHandler;
  oldElementDeclHandler = parser->m_elementDeclHandler;
  oldAttlistDeclHandler = parser->m_attlistDeclHandler;
  oldEntityDeclHandler = parser->m_entityDeclHandler;
  oldXmlDeclHandler = parser->m_xmlDeclHandler;
  oldDeclElementType = parser->m_declElementType;

  oldUserData = parser->m_userData;
  oldHandlerArg = parser->m_handlerArg;
  oldDefaultExpandInternalEntities = parser->m_defaultExpandInternalEntities;
  oldExternalEntityRefHandlerArg = parser->m_externalEntityRefHandlerArg;
#ifdef XML_DTD
  oldParamEntityParsing = parser->m_paramEntityParsing;
  oldInEntityValue = parser->m_prologState.inEntityValue;
#endif
  oldns_triplets = parser->m_ns_triplets;
  /* Note that the new parser shares the same hash secret as the old
     parser, so that dtdCopy and copyEntityTable can lookup values
     from hash tables associated with either parser without us having
     to worry which hash secrets each table has.
  */
  oldhash_secret_salt = parser->m_hash_secret_salt;
  oldReparseDeferralEnabled = parser->m_reparseDeferralEnabled;

#ifdef XML_DTD
  if (! context)
    newDtd = oldDtd;
#endif /* XML_DTD */

  /* Note that the magical uses of the pre-processor to make field
     access look more like C++ require that `parser' be overwritten
     here.  This makes this function more painful to follow than it
     would be otherwise.
  */
  if (parser->m_ns) {
    XML_Char tmp[2] = {parser->m_namespaceSeparator, 0};
    parser = parserCreate(encodingName, &parser->m_mem, tmp, newDtd);
  } else {
    parser = parserCreate(encodingName, &parser->m_mem, NULL, newDtd);
  }

  if (! parser)
    return NULL;

  parser->m_startElementHandler = oldStartElementHandler;
  parser->m_endElementHandler = oldEndElementHandler;
  parser->m_characterDataHandler = oldCharacterDataHandler;
  parser->m_processingInstructionHandler = oldProcessingInstructionHandler;
  parser->m_commentHandler = oldCommentHandler;
  parser->m_startCdataSectionHandler = oldStartCdataSectionHandler;
  parser->m_endCdataSectionHandler = oldEndCdataSectionHandler;
  parser->m_defaultHandler = oldDefaultHandler;
  parser->m_unparsedEntityDeclHandler = oldUnparsedEntityDeclHandler;
  parser->m_notationDeclHandler = oldNotationDeclHandler;
  parser->m_startNamespaceDeclHandler = oldStartNamespaceDeclHandler;
  parser->m_endNamespaceDeclHandler = oldEndNamespaceDeclHandler;
  parser->m_notStandaloneHandler = oldNotStandaloneHandler;
  parser->m_externalEntityRefHandler = oldExternalEntityRefHandler;
  parser->m_skippedEntityHandler = oldSkippedEntityHandler;
  parser->m_unknownEncodingHandler = oldUnknownEncodingHandler;
  parser->m_elementDeclHandler = oldElementDeclHandler;
  parser->m_attlistDeclHandler = oldAttlistDeclHandler;
  parser->m_entityDeclHandler = oldEntityDeclHandler;
  parser->m_xmlDeclHandler = oldXmlDeclHandler;
  parser->m_declElementType = oldDeclElementType;
  parser->m_userData = oldUserData;
  if (oldUserData == oldHandlerArg)
    parser->m_handlerArg = parser->m_userData;
  else
    parser->m_handlerArg = parser;
  if (oldExternalEntityRefHandlerArg != oldParser)
    parser->m_externalEntityRefHandlerArg = oldExternalEntityRefHandlerArg;
  parser->m_defaultExpandInternalEntities = oldDefaultExpandInternalEntities;
  parser->m_ns_triplets = oldns_triplets;
  parser->m_hash_secret_salt = oldhash_secret_salt;
  parser->m_reparseDeferralEnabled = oldReparseDeferralEnabled;
  parser->m_parentParser = oldParser;
#ifdef XML_DTD
  parser->m_paramEntityParsing = oldParamEntityParsing;
  parser->m_prologState.inEntityValue = oldInEntityValue;
  if (context) {
#endif /* XML_DTD */
    if (! dtdCopy(oldParser, parser->m_dtd, oldDtd, &parser->m_mem)
        || ! setContext(parser, context)) {
      XML_ParserFree(parser);
      return NULL;
    }
    parser->m_processor = externalEntityInitProcessor;
#ifdef XML_DTD
  } else {
    /* The DTD instance referenced by parser->m_dtd is shared between the
       document's root parser and external PE parsers, therefore one does not
       need to call setContext. In addition, one also *must* not call
       setContext, because this would overwrite existing prefix->binding
       pointers in parser->m_dtd with ones that get destroyed with the external
       PE parser. This would leave those prefixes with dangling pointers.
    */
    parser->m_isParamEntity = XML_TRUE;
    XmlPrologStateInitExternalEntity(&parser->m_prologState);
    parser->m_processor = externalParEntInitProcessor;
  }
#endif /* XML_DTD */
  return parser;
}